

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O0

void __thiscall pg::DTLSolver::DTLSolver(DTLSolver *this,Oink *oink,Game *game)

{
  Game *game_local;
  Oink *oink_local;
  DTLSolver *this_local;
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__DTLSolver_0029cbb0;
  this->interleaved = false;
  this->iterations = 0;
  this->dominions = 0;
  this->tangles = 0;
  this->steps = 0;
  std::vector<int_*,_std::allocator<int_*>_>::vector(&this->tout);
  std::vector<int_*,_std::allocator<int_*>_>::vector(&this->tv);
  std::vector<int,_std::allocator<int>_>::vector(&this->tpr);
  uintqueue::uintqueue(&this->Q);
  uintqueue::uintqueue(&this->SQ);
  std::vector<int,_std::allocator<int>_>::vector(&this->dom_vector);
  uintqueue::uintqueue(&this->Zvec);
  bitset::bitset(&this->regflag);
  uintqueue::uintqueue(&this->pea_vS);
  uintqueue::uintqueue(&this->pea_iS);
  uintqueue::uintqueue(&this->pea_S);
  bitset::bitset(&this->pea_root);
  std::vector<int,_std::allocator<int>_>::vector(&this->tangle);
  uintqueue::uintqueue(&this->tangleto);
  bitset::bitset(&this->escapes);
  bitset::bitset(&this->Z);
  bitset::bitset(&this->G);
  bitset::bitset(&this->S);
  bitset::bitset(&this->W);
  bitset::bitset(&this->Player);
  return;
}

Assistant:

DTLSolver::DTLSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}